

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O3

void __thiscall Engine::dispose(Engine *this)

{
  ScriptBlock *this_00;
  Variable *this_01;
  string *psVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ulong uVar4;
  long lVar5;
  
  this_00 = this->currentScript;
  if (this_00 != (ScriptBlock *)0x0) {
    ScriptBlock::~ScriptBlock(this_00);
  }
  operator_delete(this_00);
  if (this->variablesCount != 0) {
    uVar4 = 0;
    do {
      this_01 = this->variables[uVar4];
      if (this_01 != (Variable *)0x0) {
        Variable::~Variable(this_01);
      }
      operator_delete(this_01);
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->variablesCount);
  }
  if (this->variables != (Variable **)0x0) {
    operator_delete__(this->variables);
  }
  psVar1 = this->variableNames;
  if (psVar1 != (string *)0x0) {
    lVar5 = *(long *)((long)&psVar1[-1].field_2 + 8);
    if (lVar5 != 0) {
      paVar3 = &psVar1[lVar5 + -1].field_2;
      lVar5 = lVar5 * -0x20;
      do {
        pcVar2 = (((string *)(paVar3 + -1))->_M_dataplus)._M_p;
        if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar2) {
          operator_delete(pcVar2);
        }
        paVar3 = paVar3 + -2;
        lVar5 = lVar5 + 0x20;
      } while (lVar5 != 0);
    }
    operator_delete__((void *)((long)&psVar1[-1].field_2 + 8));
  }
  if (this->globalFunctionsCount != 0) {
    uVar4 = 0;
    do {
      operator_delete(this->globalFunctions[uVar4]);
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->globalFunctionsCount);
  }
  if (this->globalFunctions != (IGlobalFunction **)0x0) {
    operator_delete__(this->globalFunctions);
  }
  psVar1 = this->globalFunctionNames;
  if (psVar1 != (string *)0x0) {
    lVar5 = *(long *)((long)&psVar1[-1].field_2 + 8);
    if (lVar5 != 0) {
      paVar3 = &psVar1[lVar5 + -1].field_2;
      lVar5 = lVar5 * -0x20;
      do {
        pcVar2 = (((string *)(paVar3 + -1))->_M_dataplus)._M_p;
        if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar2) {
          operator_delete(pcVar2);
        }
        paVar3 = paVar3 + -2;
        lVar5 = lVar5 + 0x20;
      } while (lVar5 != 0);
    }
    operator_delete__((void *)((long)&psVar1[-1].field_2 + 8));
  }
  if (this->localFunctions != (LocalFunction **)0x0) {
    operator_delete__(this->localFunctions);
  }
  psVar1 = this->localFunctionNames;
  if (psVar1 != (string *)0x0) {
    lVar5 = *(long *)((long)&psVar1[-1].field_2 + 8);
    if (lVar5 != 0) {
      paVar3 = &psVar1[lVar5 + -1].field_2;
      lVar5 = lVar5 * -0x20;
      do {
        pcVar2 = (((string *)(paVar3 + -1))->_M_dataplus)._M_p;
        if (paVar3 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pcVar2) {
          operator_delete(pcVar2);
        }
        paVar3 = paVar3 + -2;
        lVar5 = lVar5 + 0x20;
      } while (lVar5 != 0);
    }
    operator_delete__((void *)((long)&psVar1[-1].field_2 + 8));
    return;
  }
  return;
}

Assistant:

void Engine::dispose() {
	//Script also deletes local functions
	delete this->currentScript;
	
	unsigned int i;
	for (i = 0; i < this->variablesCount; i++) {
		delete this->variables[i];
		//delete this->variableNames[i];
	}
	delete[] this->variables;
	delete[] this->variableNames;
	
	for (i = 0; i < this->globalFunctionsCount; i++) {
		delete this->globalFunctions[i];
		//delete this->globalFunctionNames[i];
	}
	delete[] this->globalFunctions;
	delete[] this->globalFunctionNames;
	
	/*for (i = 0; i < this->localFunctionsCount; i++) {
		delete this->localFunctionNames[i];
	}*/
	delete[] this->localFunctions;
	delete[] this->localFunctionNames;
}